

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argh.h
# Opt level: O0

bool __thiscall argh::parser::is_option(parser *this,string *arg)

{
  bool bVar1;
  long lVar2;
  char *pcVar3;
  string *arg_local;
  parser *this_local;
  
  lVar2 = std::__cxx11::string::size();
  if (lVar2 != 0) {
    bVar1 = is_number(this,arg);
    if (bVar1) {
      this_local._7_1_ = false;
    }
    else {
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)arg);
      this_local._7_1_ = *pcVar3 == '-';
    }
    return this_local._7_1_;
  }
  __assert_fail("0 != arg.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/fzyukio[P]cspade-full/argh.h"
                ,0x11a,"bool argh::parser::is_option(const std::string &) const");
}

Assistant:

inline bool parser::is_option(std::string const &arg) const {
        assert(0 != arg.size());
        if (is_number(arg))
            return false;
        return '-' == arg[0];
    }